

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O2

int h264_residual(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb,
                 int start,int end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int32_t (*paaiVar6) [8] [15];
  int32_t (*block) [8] [15];
  int32_t (*block_00) [8];
  int (*paiVar7) [16];
  int (*num) [16];
  
  iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,0);
  iVar2 = 1;
  if (iVar1 == 0) {
    if (slice->chroma_array_type - 1 < 2) {
      block_00 = mb->block_chroma_dc;
      lVar5 = 0;
      do {
        if (lVar5 == 2) {
          iVar2 = 0;
          iVar1 = start + -1;
          if (start == 0) {
            iVar1 = 0;
          }
          paaiVar6 = mb->block_chroma_ac;
          paiVar7 = mb->total_coeff;
          lVar5 = 0;
          while (paiVar7 = paiVar7 + 1, lVar5 != 2) {
            lVar5 = lVar5 + 1;
            uVar4 = 0;
            block = paaiVar6;
            num = paiVar7;
            while (uVar4 < slice->chroma_array_type << 2) {
              iVar3 = h264_residual_block(str,cabac,slice,mb,(int32_t *)block,*num,4,
                                          iVar2 + (int)uVar4,iVar1,end + -1,0xf,
                                          mb->coded_block_pattern & 0x20);
              uVar4 = uVar4 + 1;
              block = (int32_t (*) [8] [15])(*block + 1);
              num = (int (*) [16])(*num + 1);
              if (iVar3 != 0) {
                return 1;
              }
            }
            paaiVar6 = paaiVar6 + 1;
            iVar2 = iVar2 + 8;
          }
          goto LAB_00107f0b;
        }
        iVar1 = h264_residual_block(str,cabac,slice,mb,*block_00,(int *)0x0,3,(int)lVar5,0,
                                    slice->chroma_array_type * 4 + -1,slice->chroma_array_type << 2,
                                    (uint)((mb->coded_block_pattern & 0x30) != 0 && start == 0));
        lVar5 = lVar5 + 1;
        block_00 = block_00 + 1;
      } while (iVar1 == 0);
    }
    else {
      if (slice->chroma_array_type == 3) {
        iVar2 = h264_residual_luma(str,cabac,slice,mb,start,end,1);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = h264_residual_luma(str,cabac,slice,mb,start,end,2);
        if (iVar2 != 0) {
          return 1;
        }
      }
LAB_00107f0b:
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int h264_residual(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end) {
	if (h264_residual_luma(str, cabac, slice, mb, start, end, 0)) return 1;
	if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
		int i, j;
		for (i = 0; i < 2; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_dc[i], 0, H264_CTXBLOCKCAT_CHROMA_DC, i, 0, 4 * slice->chroma_array_type - 1, 4 * slice->chroma_array_type, (mb->coded_block_pattern & 0x30) && start == 0)) return 1;
		}
		for (i = 0; i < 2; i++) {
			for (j = 0; j < 4 * slice->chroma_array_type; j++) {
				if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_ac[i][j], &mb->total_coeff[i+1][j], H264_CTXBLOCKCAT_CHROMA_AC, i * 8 + j, (start?start-1:0), end-1, 15, mb->coded_block_pattern & 0x20)) return 1;
			}
		}
	} else if (slice->chroma_array_type == 3) {
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 1)) return 1;
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 2)) return 1;
	}
	return 0;
}